

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uchar uVar1;
  anon_union_4_2_27a871e9_for_ip_0 aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined3 uVar11;
  undefined7 uVar12;
  unsigned_short uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  int __nfds;
  int iVar16;
  uint uVar17;
  clock_t cVar18;
  size_t __n;
  ssize_t sVar19;
  time_t tVar20;
  int *piVar21;
  static_record_data *psVar22;
  record_data *prVar23;
  IP *pIVar24;
  char *pcVar25;
  unsigned_short id;
  undefined4 in_register_0000003c;
  cache *pcVar26;
  anon_struct_1056_4_b1f103b0 *paVar27;
  char *pcVar28;
  answer *paVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  socklen_t len;
  _sockaddr_in cliaddr;
  dns_header header;
  int local_30c0;
  timeval timeout;
  fd_set rset;
  question question;
  record_data *send_data [20];
  record_data tmp_ans_data [10];
  answer ans [20];
  
  rset.__fds_bits[0xe] = 0;
  rset.__fds_bits[0xf] = 0;
  rset.__fds_bits[0xc] = 0;
  rset.__fds_bits[0xd] = 0;
  rset.__fds_bits[10] = 0;
  rset.__fds_bits[0xb] = 0;
  rset.__fds_bits[8] = 0;
  rset.__fds_bits[9] = 0;
  rset.__fds_bits[6] = 0;
  rset.__fds_bits[7] = 0;
  rset.__fds_bits[4] = 0;
  rset.__fds_bits[5] = 0;
  rset.__fds_bits[2] = 0;
  rset.__fds_bits[3] = 0;
  rset.__fds_bits[0] = 0;
  rset.__fds_bits[1] = 0;
  timeout.tv_usec = 800000;
  timeout.tv_sec = 0;
  init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  __nfds = query_sockfd + 1;
LAB_00104e6e:
  do {
    do {
      do {
        iVar16 = server_sockfd + 0x3f;
        if (-1 < server_sockfd) {
          iVar16 = server_sockfd;
        }
        rset.__fds_bits[iVar16 >> 6] =
             rset.__fds_bits[iVar16 >> 6] | 1L << ((byte)server_sockfd & 0x3f);
        iVar16 = query_sockfd + 0x3f;
        if (-1 < query_sockfd) {
          iVar16 = query_sockfd;
        }
        rset.__fds_bits[iVar16 >> 6] =
             rset.__fds_bits[iVar16 >> 6] | 1L << ((byte)(query_sockfd % 0x40) & 0x3f);
        iVar16 = select(__nfds,(fd_set *)&rset,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
        if (iVar16 < 0) {
          iVar16 = 0xc1;
          pcVar25 = anon_var_dwarf_43b7;
          goto LAB_0010530c;
        }
        if (iVar16 == 0) {
          lVar33 = 0x400;
          pcVar25 = IDAdapter.data[0].message;
          do {
            if (((_Bool)pcVar25[-0xc] == true) &&
               (cVar18 = clock(), 999 < cVar18 - *(long *)(pcVar25 + -8))) {
              log_log(2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                      ,0xca,anon_var_dwarf_43cd);
              set_header_flag(pcVar25,0x8000);
              set_header_rcode_refused(pcVar25);
              iVar16 = server_sockfd;
              __n = strlen(pcVar25);
              sVar19 = sendto(iVar16,pcVar25,__n,0,(sockaddr *)(pcVar25 + -0x20),0x10);
              if (sVar19 < 0) {
                piVar21 = __errno_location();
                pcVar28 = strerror(*piVar21);
                log_log(4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                        ,0xcf,"%s:%s","sendto error:",pcVar28);
                *piVar21 = 0;
              }
              else {
                log_log(2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                        ,0xd1,anon_var_dwarf_440f);
              }
              pcVar25[-0xc] = false;
            }
            pcVar25 = pcVar25 + 0x420;
            lVar33 = lVar33 + -1;
          } while (lVar33 != 0);
        }
        iVar16 = query_sockfd + 0x3f;
        if (-1 < query_sockfd) {
          iVar16 = query_sockfd;
        }
        if (((ulong)rset.__fds_bits[iVar16 >> 6] >> ((ulong)(uint)query_sockfd & 0x3f) & 1) == 0)
        break;
        log_log(2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                ,0xdb,anon_var_dwarf_4419);
        sVar19 = recvfrom(query_sockfd,recv_buffer,0x208,0,(sockaddr *)&query_server,&len);
        if ((int)(uint)sVar19 < 0) {
          piVar21 = __errno_location();
          pcVar25 = strerror(*piVar21);
          log_log(4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0xe0,"%s:%s","recvfrom error:",pcVar25);
          *piVar21 = 0;
LAB_0010536f:
          iVar16 = 0xd;
        }
        else {
          read_dns_header(&header,recv_buffer);
          iVar16 = (int)(short)header.id % 0x400;
          if (IDAdapter.data[iVar16].valid == false) {
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0xe5,"invalid id");
            goto LAB_0010536f;
          }
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0xe8,anon_var_dwarf_445b,(ulong)header.id,
                  (ulong)IDAdapter.data[iVar16].info.old_id,(ulong)IDAdapter.data[iVar16].info.type)
          ;
          uVar1 = IDAdapter.data[iVar16].info.type;
          if (((uVar1 == '\x1c') || (uVar1 == '\x01')) &&
             (uVar17 = read_dns_answers(ans,recv_buffer), 0 < (int)uVar17)) {
            tVar20 = time((time_t *)0x0);
            read_dns_question(&question,recv_buffer + 0xc,recv_buffer);
            pIVar24 = &ans[0].address;
            prVar23 = tmp_ans_data;
            uVar31 = 0;
            do {
              aVar2 = (pIVar24->addr).field_0;
              uVar3 = *(undefined4 *)((long)&pIVar24->addr + 4);
              uVar4 = *(undefined4 *)((long)&pIVar24->addr + 8);
              uVar5 = *(undefined4 *)((long)&pIVar24->addr + 0xc);
              uVar11 = *(undefined3 *)&pIVar24->field_0x11;
              uVar6 = *(undefined4 *)&pIVar24->field_0x14;
              uVar7 = *(undefined4 *)&pIVar24->field_0x18;
              uVar8 = *(undefined4 *)&pIVar24->field_0x1c;
              (prVar23->ip).type = pIVar24->type;
              *(undefined3 *)&(prVar23->ip).field_0x11 = uVar11;
              *(undefined4 *)&(prVar23->ip).field_0x14 = uVar6;
              *(undefined4 *)&(prVar23->ip).field_0x18 = uVar7;
              *(undefined4 *)&(prVar23->ip).field_0x1c = uVar8;
              (prVar23->ip).addr.field_0 = aVar2;
              *(undefined4 *)((long)&(prVar23->ip).addr + 4) = uVar3;
              *(undefined4 *)((long)&(prVar23->ip).addr + 8) = uVar4;
              *(undefined4 *)((long)&(prVar23->ip).addr + 0xc) = uVar5;
              prVar23->label = question.label;
              prVar23->ttl = (ulong)*(uint32_t *)((long)(pIVar24 + 9) + 4) + tVar20;
              send_data[uVar31] = prVar23;
              uVar31 = uVar31 + 1;
              prVar23 = prVar23 + 1;
              pIVar24 = (IP *)((long)(pIVar24 + 0x11) + 0x10);
            } while (uVar17 != uVar31);
            log_log(1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0xfc,"count:%d",uVar31 & 0xffffffff);
            uVar1 = IDAdapter.data[iVar16].info.type;
            pcVar26 = &cacheset.A.temp;
            if (uVar1 != '\x01') {
              if (uVar1 != '\x1c') goto LAB_001051dc;
              pcVar26 = &cacheset.AAAA.temp;
            }
            set_cache_A_multi_record(pcVar26,question.label,send_data,(int)uVar31);
          }
LAB_001051dc:
          set_header_id(recv_buffer,IDAdapter.data[iVar16].info.old_id);
          sVar19 = sendto(server_sockfd,recv_buffer,(ulong)((uint)sVar19 & 0x7fffffff),0,
                          (sockaddr *)(IDAdapter.data + iVar16),0x10);
          if (sVar19 < 0) {
            piVar21 = __errno_location();
            pcVar25 = strerror(*piVar21);
            log_log(4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                    ,0x109,"%s:%s","sendto error:",pcVar25);
            *piVar21 = 0;
          }
          iVar16 = 0;
          log_log(2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
                  ,0x8a,"%s %d:%d:%d:%d:port:%d ",anon_var_dwarf_4487,
                  (ulong)(byte)cliaddr.sin_addr.s_addr,(ulong)cliaddr.sin_addr.s_addr._1_1_,
                  (ulong)cliaddr.sin_addr.s_addr._2_1_,(ulong)cliaddr.sin_addr.s_addr._3_1_,
                  (ulong)(ushort)(cliaddr.sin_port << 8 | cliaddr.sin_port >> 8));
          iVar30 = (int)(short)header.id;
          pthread_rwlock_rdlock((pthread_rwlock_t *)&IDAdapter.rwlock);
          IDAdapter.data[iVar30 % 0x400].valid = false;
          pthread_rwlock_unlock((pthread_rwlock_t *)&IDAdapter.rwlock);
        }
      } while ((iVar16 != 0xd) && (iVar16 != 0));
      iVar16 = server_sockfd + 0x3f;
      if (-1 < server_sockfd) {
        iVar16 = server_sockfd;
      }
    } while (((ulong)rset.__fds_bits[iVar16 >> 6] >> ((ulong)(uint)server_sockfd & 0x3f) & 1) == 0);
    len = 0x10;
    sVar19 = recvfrom(server_sockfd,recv_buffer,0x208,0,(sockaddr *)&cliaddr,&len);
    uVar17 = (uint)sVar19;
  } while ((int)uVar17 < 0);
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x8a,"%s %d:%d:%d:%d:port:%d ","recvfrom:",(ulong)(byte)cliaddr.sin_addr.s_addr,
          (ulong)cliaddr.sin_addr.s_addr._1_1_,(ulong)cliaddr.sin_addr.s_addr._2_1_,
          (ulong)cliaddr.sin_addr.s_addr._3_1_,
          (ulong)(ushort)(cliaddr.sin_port << 8 | cliaddr.sin_port >> 8));
  read_dns_header(&header,recv_buffer);
  if (header.field_1.flags != 1) {
    set_header_flag(recv_buffer,0x8000);
    set_header_rcode_refused(recv_buffer);
    sVar19 = sendto(server_sockfd,recv_buffer,(ulong)(uVar17 & 0x7fffffff),0,(sockaddr *)&cliaddr,
                    0x10);
    if (sVar19 < 0) {
      piVar21 = __errno_location();
      pcVar25 = strerror(*piVar21);
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x122,"%s:%s","sendto error:",pcVar25);
      *piVar21 = 0;
    }
    else {
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x124,anon_var_dwarf_44ec + 0x21);
    }
  }
  read_dns_questions(&question,recv_buffer);
  pcVar25 = RRtype_to_str((uint)question.qtype);
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x128,"%s %s",pcVar25,&question);
  psVar22 = get_static_cache(&cacheset.blacklist,question.label);
  if (psVar22 != (static_record_data *)0x0) {
    log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
            ,300,anon_var_dwarf_44cb);
    set_header_flag(recv_buffer,0x8000);
    set_header_rcode_name_error(recv_buffer);
    sVar19 = sendto(server_sockfd,recv_buffer,(ulong)(uVar17 & 0x7fffffff),0,(sockaddr *)&cliaddr,
                    0x10);
    if (-1 < sVar19) {
      iVar16 = 0x133;
      pcVar25 = anon_var_dwarf_440f;
LAB_0010530c:
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,iVar16,pcVar25);
      goto LAB_00104e6e;
    }
    piVar21 = __errno_location();
    pcVar25 = strerror(*piVar21);
    iVar16 = 0x131;
    pcVar28 = "sendto error:";
    goto LAB_0010560a;
  }
  if (question.qtype == 0x1c) {
    psVar22 = get_static_cache(&cacheset.AAAA.local,question.label);
    pcVar26 = &cacheset.AAAA.temp;
LAB_0010563d:
    if (psVar22 != (static_record_data *)0x0) goto LAB_0010564a;
    prVar23 = get_cache_A_record(pcVar26,question.label);
    psVar22 = (static_record_data *)0x0;
  }
  else {
    if (question.qtype == 1) {
      psVar22 = get_static_cache(&cacheset.A.local,question.label);
      pcVar26 = &cacheset.A.temp;
      goto LAB_0010563d;
    }
    psVar22 = (static_record_data *)0x0;
LAB_0010564a:
    prVar23 = (record_data *)0x0;
  }
  uVar15 = question.qclass;
  uVar14 = question.qtype;
  if (psVar22 == (static_record_data *)0x0) {
    uVar32 = 0;
    if (prVar23 != (record_data *)0x0) {
      tVar20 = time((time_t *)0x0);
      uVar15 = question.qclass;
      uVar14 = question.qtype;
      paVar29 = ans;
      do {
        local_30c0 = (int)tVar20;
        paVar29->ttl = (int)prVar23->ttl - local_30c0;
        uVar9 = *(undefined8 *)((long)&(prVar23->ip).addr + 8);
        uVar1 = (prVar23->ip).type;
        uVar12 = *(undefined7 *)&(prVar23->ip).field_0x11;
        uVar10 = *(undefined8 *)&(prVar23->ip).field_0x18;
        *(undefined8 *)&(paVar29->address).addr = *(undefined8 *)&(prVar23->ip).addr;
        *(undefined8 *)((long)&(paVar29->address).addr + 8) = uVar9;
        (paVar29->address).type = uVar1;
        *(undefined7 *)&(paVar29->address).field_0x11 = uVar12;
        *(undefined8 *)&(paVar29->address).field_0x18 = uVar10;
        strcpy(paVar29->name,question.label);
        paVar29->type = uVar14;
        paVar29->class_ = uVar15;
        paVar29->has_cname = false;
        strcpy(paVar29->name,question.label);
        prVar23 = prVar23->next;
        paVar29 = paVar29 + 1;
        uVar32 = uVar32 + 1;
      } while (prVar23 != (record_data *)0x0);
    }
  }
  else {
    uVar32 = 0;
    paVar29 = ans;
    do {
      paVar29->ttl = 0xe10;
      uVar9 = *(undefined8 *)((long)&(psVar22->ip).addr + 8);
      uVar1 = (psVar22->ip).type;
      uVar12 = *(undefined7 *)&(psVar22->ip).field_0x11;
      uVar10 = *(undefined8 *)&(psVar22->ip).field_0x18;
      *(undefined8 *)&(paVar29->address).addr = *(undefined8 *)&(psVar22->ip).addr;
      *(undefined8 *)((long)&(paVar29->address).addr + 8) = uVar9;
      (paVar29->address).type = uVar1;
      *(undefined7 *)&(paVar29->address).field_0x11 = uVar12;
      *(undefined8 *)&(paVar29->address).field_0x18 = uVar10;
      paVar29->type = uVar14;
      paVar29->class_ = uVar15;
      paVar29->has_cname = false;
      strcpy(paVar29->name,question.label);
      psVar22 = psVar22->next;
      paVar29 = paVar29 + 1;
      uVar32 = uVar32 + 1;
    } while (psVar22 != (static_record_data *)0x0);
  }
  if (uVar32 != 0) {
    log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
            ,0x161,anon_var_dwarf_4503 + 3);
    uVar17 = write_dns_response_by_query(recv_buffer,ans,(uint16_t)uVar32);
    sVar19 = sendto(server_sockfd,recv_buffer,(long)(int)uVar17,0,(sockaddr *)&cliaddr,0x10);
    if (sVar19 < 0) {
      piVar21 = __errno_location();
      pcVar25 = strerror(*piVar21);
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x168,"%s:%s","send error",pcVar25);
      *piVar21 = 0;
    }
    else {
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c"
              ,0x16a,anon_var_dwarf_44ec,(ulong)uVar17,(ulong)uVar32);
    }
    goto LAB_00104e6e;
  }
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x16e,anon_var_dwarf_4503);
  uVar15 = question.qtype;
  uVar14 = header.id;
  recv_buffer[uVar17 & 0x7fffffff] = '\0';
  cVar18 = clock();
  pthread_rwlock_wrlock((pthread_rwlock_t *)&IDAdapter.rwlock);
  uVar13 = IDAdapter.next;
  lVar33 = (long)(short)IDAdapter.next;
  id = 0xffff;
  if (IDAdapter.data[lVar33].valid == false) {
    paVar27 = IDAdapter.data + lVar33;
    IDAdapter.data[lVar33].valid = true;
    (paVar27->info).addr.sin_family = cliaddr.sin_family;
    (paVar27->info).addr.sin_port = cliaddr.sin_port;
    (paVar27->info).addr.sin_addr =
         (in_addr)(int)(CONCAT17(cliaddr.sin_addr.s_addr._3_1_,
                                 CONCAT16(cliaddr.sin_addr.s_addr._2_1_,
                                          CONCAT15(cliaddr.sin_addr.s_addr._1_1_,
                                                   CONCAT14((byte)cliaddr.sin_addr.s_addr,
                                                            CONCAT22(cliaddr.sin_port,
                                                                     cliaddr.sin_family))))) >> 0x20
                       );
    *&IDAdapter.data[lVar33].info.addr.sin_zero = cliaddr.sin_zero;
    IDAdapter.data[lVar33].info.old_id = uVar14;
    IDAdapter.data[lVar33].info.type = (uchar)uVar15;
    IDAdapter.data[lVar33].start = cVar18;
    strcpy(IDAdapter.data[lVar33].message,recv_buffer);
    IDAdapter.next = IDAdapter.next + 1 & 0x3ff;
    pthread_rwlock_unlock((pthread_rwlock_t *)&IDAdapter.rwlock);
    id = uVar13;
  }
  if (id == 0xffff) goto LAB_00104e6e;
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x172,"old_id=%d,new_id=%d",(ulong)header.id,(ulong)(uint)(int)(short)id);
  len = 0x10;
  set_header_id(recv_buffer,id);
  sVar19 = sendto(query_sockfd,recv_buffer,(ulong)(uVar17 & 0x7fffffff),0,(sockaddr *)&query_server,
                  0x10);
  if (-1 < sVar19) goto LAB_00104e6e;
  piVar21 = __errno_location();
  pcVar25 = strerror(*piVar21);
  iVar16 = 0x177;
  pcVar28 = "sendto error";
LAB_0010560a:
  log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          iVar16,"%s:%s",pcVar28,pcVar25);
  *piVar21 = 0;
  goto LAB_00104e6e;
}

Assistant:

int main(int argc, char **argv) {

  //_sockaddr_in在不启用ipv6的情况下是sockaddr_in;
  //否则是struct sockaddr_in6
  _sockaddr_in cliaddr;

  socklen_t len, clilen;
  
  struct dns_header header;//暂存DNS header
  struct question question;//暂存DNS question
  struct answer ans[20];//暂存DNS answer
  struct record_data tmp_ans_data[10];
  struct record_data *data;//获取缓存的指针
  struct static_record_data *static_data;//获取本地缓存的指针
  // unsigned ip;
  
  int _size; //临时变量
  time_t now;

  fd_set rset;//读集合
  FD_ZERO(&rset);

  struct timeval timeout; //select函数中timeout参数
  timeout.tv_usec= SELECT_TTL; //设置timeout的值
  timeout.tv_sec=0;
  //初始化,处理命令行参数，初始化cache，初始化WSA和socket套接字,设置超时，绑定端口
  init(argc,argv);

  clilen = sizeof(cliaddr);
     

  int max_fd = query_sockfd + 1;
  // struct timeval timeout;
  while (1) {
    FD_SET(server_sockfd,&rset);
    FD_SET(query_sockfd,&rset);
    
    int work_fd;  
    if( (work_fd = select(max_fd,&rset,NULL,NULL,&timeout))<0){
      //!!!!加处理
      log_info("跳过");
      continue;
    }

    // //查找超时的项并处理
    if(work_fd==0){
      for(int i=0;i<IDAadpter_SIZE;i++){
        if(IDAdapter.data[i].valid&&(clock()-IDAdapter.data[i].start>=DNS_TTL)){
          IDtoAddr * idtoaddr = &IDAdapter.data[i].info;
          log_info("超时回复");
          set_header_flag(IDAdapter.data[i].message,FLAG_RESPONSE_NORMAL);
          set_header_rcode_refused(IDAdapter.data[i].message);
          if (sendto(server_sockfd, IDAdapter.data[i].message, strlen(IDAdapter.data[i].message), 0,(SA *)&idtoaddr->addr,
                    sizeof(idtoaddr->addr)) < 0) {
              log_error_shortcut("sendto error:");
          } else {
            log_info("发送成功");
          }
          IDAdapter.data[i].valid=false;
        }
      }
    }
    
    handle_relay://处理中继
    if (FD_ISSET(query_sockfd,&rset)){
      //优先处理未完成的请求
      log_info("处理DNS服务器发来请求");
      int total_size;
      int ans_num = 0;
      IDtoAddr * iptoaddr;
      if (( (total_size = recvfrom(query_sockfd , recv_buffer, MAX_DNS_SIZE, 0,(SA *)&query_server, &len))<0)){
          log_error_shortcut("recvfrom error:");
          goto handle_request;//跳过本次处理
      }
      read_dns_header(&header, recv_buffer);
      if( (iptoaddr = IDAdapter_get(header.id)) == NULL){
        log_error("invalid id");
        goto handle_request;//跳过本次处理
      }
      log_info("报文id=%d,旧id=%d type=%d",header.id,iptoaddr->old_id,iptoaddr->type);
      if(iptoaddr->type == RRTYPE_A||iptoaddr->type==RRTYPE_AAAA){
        //可以缓存的类型
        ans_num = read_dns_answers(ans, recv_buffer);
        // log_debug("ans_num: %d\n",ans_num);
        if (ans_num > 0) {
          int count =0;
          struct record_data* send_data[20];
          now = time(NULL);
          read_dns_question(&question,recv_buffer+12,recv_buffer);
          for(int i=0;i<ans_num;i++){
              // memcpy_s(&tmp_ans_data[count].ip,sizeof(struct IP),&ans[i].address,sizeof(struct IP)); 
              // puts(ans[0].name);
              memcpy(&tmp_ans_data[count].ip,&ans[i].address.addr,sizeof(struct IP));
              // printf("%04x:%04x:%04x\n",ans[i].address.addr.v6byte[0],ans[i].address.addr.v6byte[1],ans[i].address.addr.v6byte[2]);
              tmp_ans_data[count].label = question.label;
              tmp_ans_data[count].ttl = now + ans[i].ttl;
              send_data[count] = &tmp_ans_data[count];
              count++;
          }
          log_debug("count:%d",count);
          if(count>0){
            
            if(iptoaddr->type == RRTYPE_A){
              set_cache_A_multi_record(&cacheset.A.temp,question.label,(void**)send_data,count);
            }else if(iptoaddr->type == RRTYPE_AAAA){
              set_cache_A_multi_record(&cacheset.AAAA.temp,question.label,(void**)send_data,count);
            }
          }
        }
      }
      set_header_id(recv_buffer,iptoaddr->old_id);
      if ( (sendto(server_sockfd, recv_buffer, total_size, 0, (SA *)&(iptoaddr->addr),sizeof(iptoaddr->addr) )  ) < 0){
          log_error_shortcut("sendto error:");
      }
      log_ip("处理结束: ",&cliaddr);
      IDAdapter_pop(header.id);
      
    }

    handle_request:
    if (FD_ISSET(server_sockfd,&rset)){
      //如果有一个新的请求
      int rec;
      len = clilen;
      if ((rec = recvfrom(server_sockfd, recv_buffer, MAX_DNS_SIZE, 0, (SA *)&cliaddr, &len))<0){
      continue;
    }
      log_ip("recvfrom:",&cliaddr);

      read_dns_header(&header, recv_buffer);
      // sprint_dns(recv_buffer);
      if (header.flags != htons(FLAG_QUERY)) {
        //不是询问，也丢弃
        set_header_flag(recv_buffer,FLAG_RESPONSE_NORMAL);
        set_header_rcode_refused(recv_buffer);
        if (sendto(server_sockfd, recv_buffer, rec , 0,(SA *)&cliaddr,
                    sizeof(cliaddr)) < 0) {
          log_error_shortcut("sendto error:");
        } else {
          log_info("成功回复");
        }
      }
      read_dns_questions(&question, recv_buffer);
      log_info("%s %s",RRtype_to_str(question.qtype),question.label);
      data = NULL;
      static_data = NULL;
      if ( (static_data=get_static_cache(&cacheset.blacklist,question.label)) ){//不能少括号
        log_info("拦截请求");
        set_header_flag(recv_buffer,FLAG_RESPONSE_NORMAL);
        set_header_rcode_name_error(recv_buffer);
        if (sendto(server_sockfd, recv_buffer, rec , 0,(SA *)&cliaddr,
                  sizeof(cliaddr)) < 0) {
            log_error_shortcut("sendto error:");
        } else {
          log_info("发送成功");
        }
        continue;
      }
      if(question.qtype==RRTYPE_A){
        // puts(question.label);
        static_data = get_static_cache(&cacheset.A.local,question.label);
        // if(!static_data)puts("aaaaa");
        if(!static_data)data = get_cache_A_record(&cacheset.A.temp,question.label);
      }else if (question.qtype==RRTYPE_AAAA){
        static_data = get_static_cache(&cacheset.AAAA.local,question.label);
        if(!static_data)data = get_cache_A_record(&cacheset.AAAA.temp,question.label);
      }
      int count=0;
      if(static_data){
        //取到本地记录
        while(static_data){
          ans[count].ttl = 3600;//1小时
          memcpy(&ans[count].address, &static_data->ip, sizeof(struct IP));
          ans[count].type = question.qtype;
          ans[count].class_ = question.qclass;
          ans[count].has_cname = false;
          strcpy(ans[count].name,question.label);
          // strcpy_s(ans[count].name, sizeof(ans[0].name),question.label);
          count += 1;
          static_data = static_data->next;
        }
      }else if(data){
        //取到
        now = time(NULL);
        while(data){
          ans[count].ttl = data->ttl - now;
          memcpy(&ans[count].address, &data->ip, sizeof(struct IP));
          strcpy(ans[count].name,question.label);
          // strcpy_s(ans[count].name, sizeof(ans[0].name),question.label);
          ans[count].type = question.qtype;
          ans[count].class_ = question.qclass;
          ans[count].has_cname = false;
          // strcpy_s(ans[count].name, sizeof(ans[0].name),question.label);
          strcpy(ans[count].name, question.label);
          count++;
          data=data->next;
        }
      }
      if(count){
        //取到缓存   
        log_info("取到缓存");
        // printf("aaa\n%04x:%04x:%04x:%04x",
        // ans[0].address.addr.v6byte[0], ans[0].address.addr.v6byte[1], ans[0].address.addr.v6byte[2],ans[0].address.addr.v6byte[3]);
        _size = write_dns_response_by_query(recv_buffer, ans, count);
        // sprint_dns(query_buffer);
        if (sendto(server_sockfd, recv_buffer, _size, 0, (SA *)&cliaddr,
                  sizeof(cliaddr)) < 0) {
          log_error_shortcut("send error");
        } else {
          log_info("send data. size=%d ans数量=%d .成功回复",_size,count);
        }
      }else{
        //未取到缓存，需要查询
        log_info("未取到缓存");
        short new_id=0;
        *(recv_buffer+rec)='\0';
        if ( (new_id = IDAdapter_push(header.id,&cliaddr,question.qtype,clock(),recv_buffer)) !=-1){
            log_debug("old_id=%d,new_id=%d",header.id ,new_id);
            len = sizeof(struct sockaddr_in);
            set_header_id(recv_buffer,new_id);
            if (sendto(query_sockfd, (char *)recv_buffer, rec, 0, (SA *)&query_server,
                      ADDR_LEN)<0) {
              log_error_shortcut("sendto error");
            }
        }
      }
    }
    // err_handle:

  }
  return 0;
}